

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSlabType::~IfcSlabType(IfcSlabType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)this = 0x92be18;
  *(undefined8 *)&this->field_0x1c0 = 0x92bf30;
  *(undefined8 *)&this->field_0x88 = 0x92be40;
  *(undefined8 *)&this->field_0x98 = 0x92be68;
  *(undefined8 *)&this->field_0xf0 = 0x92be90;
  *(undefined8 *)&this->field_0x148 = 0x92beb8;
  *(undefined8 *)&this->field_0x180 = 0x92bee0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x92bf08;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).field_0x10;
  if (puVar1 != &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>).field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)this = 0x92c1f8;
  *(undefined8 *)&this->field_0x1c0 = 0x92c2c0;
  *(undefined8 *)&this->field_0x88 = 0x92c220;
  *(undefined8 *)&this->field_0x98 = 0x92c248;
  *(undefined8 *)&this->field_0xf0 = 0x92c270;
  *(undefined8 *)&this->field_0x148 = 0x92c298;
  if (*(undefined1 **)&this->field_0x158 != &this->field_0x168) {
    operator_delete(*(undefined1 **)&this->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__0092bf58);
  operator_delete(this);
  return;
}

Assistant:

IfcSlabType() : Object("IfcSlabType") {}